

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_24939c::Db::parseBaseUnresolvedName(Db *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  Node *local_48;
  Node *TA;
  Node *Oper;
  StringView local_28;
  Db *local_18;
  Db *this_local;
  
  local_18 = this;
  cVar1 = look(this,0);
  iVar3 = isdigit((int)cVar1);
  if (iVar3 == 0) {
    StringView::StringView(&local_28,"dn");
    bVar2 = consumeIf(this,local_28);
    if (bVar2) {
      this_local = (Db *)parseDestructorName(this);
    }
    else {
      StringView::StringView((StringView *)&Oper,"on");
      consumeIf(this,_Oper);
      TA = parseOperatorName(this,(NameState *)0x0);
      if (TA == (Node *)0x0) {
        this_local = (Db *)0x0;
      }
      else {
        cVar1 = look(this,0);
        if (cVar1 == 'I') {
          local_48 = parseTemplateArgs(this,false);
          if (local_48 == (Node *)0x0) {
            this_local = (Db *)0x0;
          }
          else {
            this_local = (Db *)(anonymous_namespace)::Db::
                               make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                                         ((Db *)this,&TA,&local_48);
          }
        }
        else {
          this_local = (Db *)TA;
        }
      }
    }
  }
  else {
    this_local = (Db *)parseSimpleId(this);
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseBaseUnresolvedName() {
  if (std::isdigit(look()))
    return parseSimpleId();

  if (consumeIf("dn"))
    return parseDestructorName();

  consumeIf("on");

  Node *Oper = parseOperatorName(/*NameState=*/nullptr);
  if (Oper == nullptr)
    return nullptr;
  if (look() == 'I') {
    Node *TA = parseTemplateArgs();
    if (TA == nullptr)
      return nullptr;
    return make<NameWithTemplateArgs>(Oper, TA);
  }
  return Oper;
}